

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

int32_t u_countChar32_63(UChar *s,int32_t length)

{
  int iVar1;
  int iVar2;
  UChar *pUVar3;
  long lVar4;
  
  iVar1 = 0;
  if (-2 < length && s != (UChar *)0x0) {
    iVar1 = 0;
    if (length < 0) {
      while (*s != L'\0') {
        pUVar3 = s + 1;
        if (((*s & 0xfc00U) == 0xd800) && ((s[1] & 0xfc00U) == 0xdc00)) {
          pUVar3 = s + 2;
        }
        iVar1 = iVar1 + 1;
        s = pUVar3;
      }
    }
    else {
      for (; length != 0; length = length + iVar2) {
        if ((length == 1) || ((*s & 0xfc00U) != 0xd800)) {
LAB_002dde8e:
          lVar4 = 2;
          iVar2 = -1;
        }
        else {
          lVar4 = 4;
          iVar2 = -2;
          if ((s[1] & 0xfc00U) != 0xdc00) goto LAB_002dde8e;
        }
        s = (UChar *)((long)s + lVar4);
        iVar1 = iVar1 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_countChar32(const UChar *s, int32_t length) {
    int32_t count;

    if(s==NULL || length<-1) {
        return 0;
    }

    count=0;
    if(length>=0) {
        while(length>0) {
            ++count;
            if(U16_IS_LEAD(*s) && length>=2 && U16_IS_TRAIL(*(s+1))) {
                s+=2;
                length-=2;
            } else {
                ++s;
                --length;
            }
        }
    } else /* length==-1 */ {
        UChar c;

        for(;;) {
            if((c=*s++)==0) {
                break;
            }
            ++count;

            /*
             * sufficient to look ahead one because of UTF-16;
             * safe to look ahead one because at worst that would be the terminating NUL
             */
            if(U16_IS_LEAD(c) && U16_IS_TRAIL(*s)) {
                ++s;
            }
        }
    }
    return count;
}